

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_induct(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  CHAR_DATA *ch_00;
  size_t sVar6;
  char *pcVar7;
  cabal_type *pcVar8;
  long lVar9;
  basic_string_view<char> format;
  basic_format_args<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  char *local_6e88 [2];
  ulong local_6e78;
  char *local_6e68;
  buffer<char> local_6e50;
  char local_6e30 [504];
  char local_6c38 [4608];
  char arg2 [4608];
  char arg1 [4608];
  char query [4608];
  char tstr [4608];
  char tbuf [4608];
  
  bVar1 = is_npc(ch);
  if (bVar1) {
    return;
  }
  pcVar5 = one_argument(argument,arg1);
  one_argument(pcVar5,arg2);
  if ((((ch->level < 0x36) && (ch->pcdata->induct != 5)) || (bVar1 = is_npc(ch), bVar1)) ||
     ((ch->cabal == 3 && (bVar1 = is_immortal(ch), !bVar1)))) {
    pcVar5 = "Huh?\n\r";
  }
  else if ((arg1[0] == '\0') || (arg2[0] == '\0')) {
    iVar4 = get_trust(ch);
    if (0x35 < iVar4) {
      send_to_char("INDUCT:   Members / Max:\n\r",ch);
      send_to_char("--------------------------\n\r",ch);
      pcVar8 = cabal_table;
      lVar9 = 1;
      do {
        pcVar8 = pcVar8 + 1;
        sprintf(tbuf,"%d",(ulong)(uint)(int)cabal_max[lVar9]);
        local_6e88[0] = capitalize(pcVar8->name);
        local_6e68 = tbuf;
        if (pcVar8->max_members == 1) {
          local_6e68 = "none";
        }
        local_6e78 = (ulong)(uint)(int)cabal_members[lVar9];
        local_6e50.size_ = 0;
        local_6e50._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
        local_6e50.ptr_ = local_6e30;
        local_6e50.capacity_ = 500;
        format.size_ = 0x11;
        format.data_ = "%-12s %-4d / %s\n\r";
        args.field_1.values_ =
             (value<fmt::v9::basic_printf_context<fmt::v9::appender,_char>_> *)local_6e88;
        args.desc_ = 0xc1c;
        fmt::v9::detail::vprintf<char,fmt::v9::basic_printf_context<fmt::v9::appender,char>>
                  (&local_6e50,format,args);
        buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&buffer,local_6e50.ptr_,local_6e50.ptr_ + local_6e50.size_);
        if (local_6e50.ptr_ != local_6e30) {
          operator_delete(local_6e50.ptr_,local_6e50.capacity_);
        }
        send_to_char(buffer._M_dataplus._M_p,ch);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)buffer._M_dataplus._M_p != &buffer.field_2) {
          operator_delete(buffer._M_dataplus._M_p,buffer.field_2._M_allocated_capacity + 1);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 7);
      send_to_char("--------------------------\n\r",ch);
    }
    pcVar5 = "Syntax: induct <char> <cabal name>\n\r";
  }
  else {
    ch_00 = get_char_world(ch,arg1);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar5 = "They aren\'t playing.\n\r";
    }
    else {
      bVar1 = is_npc(ch_00);
      if ((!bVar1) || (bVar1 = is_immortal(ch), bVar1)) {
        bVar1 = str_prefix(arg2,"none");
        if (bVar1) {
          if (ch_00->cabal == 0) {
            uVar3 = cabal_lookup(arg2);
            if (uVar3 == 0) {
              pcVar5 = "No such cabal exists.\n\r";
            }
            else if ((uVar3 == (int)ch->cabal) || (iVar4 = get_trust(ch), 0x35 < iVar4)) {
              if (((cabal_table[(int)uVar3].max_members < 2) ||
                  (cabal_members[(int)uVar3] < cabal_max[(int)uVar3])) ||
                 (iVar4 = get_trust(ch), 0x35 < iVar4)) {
                sprintf(local_6c38,"%s has been inducted into the %s.",ch_00->name,
                        cabal_table[(int)uVar3].long_name);
                act(local_6c38,ch_00,(void *)0x0,ch,1);
                sVar6 = strlen(local_6c38);
                (local_6c38 + sVar6)[0] = '\n';
                (local_6c38 + sVar6)[1] = '\r';
                local_6c38[sVar6 + 2] = '\0';
                send_to_char(local_6c38,ch);
                sprintf(local_6c38,"You have been inducted into the %s.\n\r",
                        cabal_table[(int)uVar3].long_name);
                send_to_char(local_6c38,ch_00);
                ch_00->cabal = (short)uVar3;
                pcVar5 = ch_00->name;
                pcVar7 = capitalize(cabal_table[(int)uVar3].name);
                sprintf(tstr,"%s into %s.",pcVar5,pcVar7);
                log_naughty(ch,tstr,5);
                pcVar5 = capitalize(cabal_table[(int)uVar3].name);
                sprintf(local_6c38,"AUTO: Inducted into %s by %s.\n\r",pcVar5,ch->true_name);
                bVar1 = is_immortal(ch_00);
                if (!bVar1) {
                  add_history((CHAR_DATA *)0x0,ch_00,local_6c38);
                }
                bVar1 = is_immortal(ch);
                if ((bVar1) && (bVar1 = is_immortal(ch_00), bVar1)) {
                  sprintf(query,
                          "insert into inductions(ch, victim, cabal, ctime, chsite, victimsite) values(\'%s\',\'%s\',%d,%ld,\'%s\',\'%s\')"
                          ,ch->true_name,ch_00->true_name,(ulong)uVar3,current_time,ch->pcdata->host
                          ,ch_00->pcdata->host);
                  one_query(query);
                }
                cabal_members[(int)uVar3] = cabal_members[(int)uVar3] + 1;
                bVar1 = str_cmp(cabal_table[ch_00->cabal].extitle,"");
                if (bVar1) {
                  set_extitle(ch_00,cabal_table[ch_00->cabal].extitle);
                }
                ch_00->pcdata->cabal_level = (int)cabal_table[ch_00->cabal].start_level;
                update_cskills(ch_00);
                return;
              }
              pcVar5 = "That cabal is full.\n\r";
            }
            else {
              pcVar5 = "You may only induct into the cabal which you belong.\n\r";
            }
          }
          else {
            pcVar5 = "That person is already in a cabal!\n\r";
          }
        }
        else {
          sVar2 = ch->cabal;
          if (sVar2 != ch_00->cabal) {
            iVar4 = get_trust(ch);
            if (iVar4 < 0x38) {
              pcVar5 = "You have no power over that person\'s affiliations!\n\r";
              goto LAB_002646d5;
            }
            sVar2 = ch_00->cabal;
          }
          if (sVar2 != 0) {
            if (ch_00 != ch) {
              send_to_char("They have been inducted into None.\n\r",ch);
            }
            send_to_char("You have been inducted into None.\n\r",ch_00);
            lVar9 = (long)ch_00->cabal;
            cabal_members[lVar9] = cabal_members[lVar9] + -1;
            ch_00->cabal = 0;
            ch_00->pcdata->cabal_level = 0;
            update_cskills(ch_00);
            if (lVar9 == 0) {
              pcVar5 = "-";
            }
            else {
              pcVar5 = capitalize(cabal_table[lVar9].name);
            }
            sprintf(local_6c38,"AUTO: Uninducted from %s by %s.\n\r",pcVar5,ch->true_name);
            bVar1 = is_immortal(ch_00);
            if (bVar1) {
              return;
            }
            add_history((CHAR_DATA *)0x0,ch_00,local_6c38);
            return;
          }
          pcVar5 = "They are already not in a cabal.\n\r";
        }
      }
      else {
        pcVar5 = "Mobs can\'t be inducted into Cabals.\n\r";
      }
    }
  }
LAB_002646d5:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_induct(CHAR_DATA *ch, char *argument)
{
	// arg1 = character, arg2 = cabal name
	char arg1[MAX_INPUT_LENGTH], arg2[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH], tbuf[MAX_STRING_LENGTH];
	char tstr[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int cabal;
	int i;
	char query[MSL];

	if (is_npc(ch))
		return;

	argument = one_argument(argument, arg1); // character
	argument = one_argument(argument, arg2); // cabal name

	/**
	 *  IF the character calling induct is under level 54 and not the cabal leader,
	 *  or the character calling induct is an NPC,
	 *  or the character calling induct is in horde and is not an immortal
	 *  THEN tell them "huh?" and return.
	 */
	
	if ((ch->level < 54 && ch->pcdata->induct != CABAL_LEADER)
		|| is_npc(ch)
		|| ch->cabal == CABAL_HORDE && !is_immortal(ch))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (arg1[0] == '\0' || arg2[0] == '\0')
	{
		if (get_trust(ch) > 53)
		{
			send_to_char("INDUCT:   Members / Max:\n\r", ch);
			send_to_char("--------------------------\n\r", ch);

			for (i = 1; i < MAX_CABAL; i++)
			{
				sprintf(tbuf, "%d", cabal_max[i]);
				auto buffer = fmt::sprintf("%-12s %-4d / %s\n\r", 
					capitalize(cabal_table[i].name), 
					cabal_members[i],
					(cabal_table[i].max_members != 1) ? tbuf : "none");
				send_to_char(buffer.c_str(), ch);
			}

			send_to_char("--------------------------\n\r", ch);
			send_to_char("Syntax: induct <char> <cabal name>\n\r", ch);
			return;
		}

		buf[0] = '\0';
		send_to_char("Syntax: induct <char> <cabal name>\n\r", ch);
		/*
		send_to_char("Valid Cabals are: ",ch);
		for (i = 1; i < (MAX_CABAL -1); i++)
		{
			sprintf(buf,"%s, ", cabal_table[i].name);
			send_to_char(buf,ch);
		}
		sprintf(buf,"%s.\n\r",cabal_table[MAX_CABAL -1].name);
		send_to_char(buf,ch);
		*/
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	if (is_npc(victim) && !is_immortal(ch))
	{
		send_to_char("Mobs can't be inducted into Cabals.\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "none"))
	{
		if (ch->cabal != victim->cabal && get_trust(ch) < 56)
		{
			send_to_char("You have no power over that person's affiliations!\n\r", ch);
			return;
		}
		else
		{
			if (!victim->cabal)
			{
				send_to_char("They are already not in a cabal.\n\r", ch);
				return;
			}

			if (victim != ch)
			{
				send_to_char("They have been inducted into None.\n\r", ch);
				send_to_char("You have been inducted into None.\n\r", victim);
			}
			else
			{
				send_to_char("You have been inducted into None.\n\r", victim);
			}

			cabal = victim->cabal;
			/* take away cabal skills */
			cabal_members[victim->cabal]--;
			victim->cabal = 0;
			victim->pcdata->cabal_level = 0;

			update_cskills(victim);

			sprintf(buf, "AUTO: Uninducted from %s by %s.\n\r",
				cabal ? capitalize(cabal_table[cabal].name) : "-",
				ch->true_name);

			if (!is_immortal(victim))
				add_history(nullptr, victim, buf);

			return;
		}
	}

	if (victim->cabal != 0)
	{
		send_to_char("That person is already in a cabal!\n\r", ch);
		return;
	}

	cabal = cabal_lookup(arg2);
	if (cabal == 0)
	{
		send_to_char("No such cabal exists.\n\r", ch);
		return;
	}

	if (cabal != ch->cabal && get_trust(ch) < 54)
	{
		send_to_char("You may only induct into the cabal which you belong.\n\r", ch);
		return;
	}

	if (cabal_table[cabal].max_members > 1 && cabal_max[cabal] <= cabal_members[cabal] && get_trust(ch) < 54)
	{
		// Is cabal full? If so, so solly cholly.
		send_to_char("That cabal is full.\n\r", ch);
		return;
	}

	sprintf(buf, "%s has been inducted into the %s.", victim->name, cabal_table[cabal].long_name);
	act(buf, victim, 0, ch, TO_NOTVICT);

	strcat(buf, "\n\r");
	send_to_char(buf, ch);

	sprintf(buf, "You have been inducted into the %s.\n\r", cabal_table[cabal].long_name);
	send_to_char(buf, victim);

	victim->cabal = cabal;

	sprintf(tstr, "%s into %s.", victim->name, capitalize(cabal_table[cabal].name));
	log_naughty(ch, tstr, 5);

	sprintf(buf, "AUTO: Inducted into %s by %s.\n\r", capitalize(cabal_table[cabal].name), ch->true_name);
	if (!is_immortal(victim))
		add_history(nullptr, victim, buf);

	if (is_immortal(ch) && is_immortal(victim))
	{
		sprintf(query, "insert into inductions(ch, victim, cabal, ctime, chsite, victimsite) values('%s','%s',%d,%ld,'%s','%s')",
			ch->true_name,
			victim->true_name,
			cabal,
			current_time,
			ch->pcdata->host,
			victim->pcdata->host);
		one_query(query);
	}

	cabal_members[cabal]++;

	if (str_cmp(cabal_table[victim->cabal].extitle, ""))
		set_extitle(victim, cabal_table[victim->cabal].extitle);

	victim->pcdata->cabal_level = cabal_table[victim->cabal].start_level;
	update_cskills(victim);
}